

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::Desugarer::makeArrayComprehension(Desugarer *this,ArrayComprehension *ast)

{
  AST *pAVar1;
  sockaddr *psVar2;
  Kind *pKVar3;
  ArrayComprehension *pAVar4;
  ulong uVar5;
  Identifier *pIVar6;
  pointer pCVar7;
  Binary *pBVar8;
  Apply *pAVar9;
  int *piVar10;
  Var *pVVar11;
  Index *body;
  Function *pFVar12;
  LiteralString *b;
  Array *expr;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  Desugarer *pDVar17;
  ulong uVar18;
  long lVar19;
  LocationRange *loc;
  long lVar20;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  initializer_list<jsonnet::internal::ArgParam> __l_01;
  initializer_list<jsonnet::internal::Local::Bind> __l_02;
  initializer_list<jsonnet::internal::ArgParam> __l_03;
  bool local_4cd;
  bool local_4cc;
  bool local_4cb;
  bool local_4ca;
  bool local_4c9;
  ulong local_4c8;
  Desugarer *local_4c0;
  allocator<char32_t> local_4b5;
  allocator_type local_4b4;
  allocator<char32_t> local_4b3;
  allocator_type local_4b2;
  allocator_type local_4b1;
  LocationRange *local_4b0;
  ArrayComprehension *local_4a8;
  Identifier *local_4a0;
  AST *in;
  sockaddr *local_490;
  AST *out;
  BinaryOp local_47c;
  long local_478;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _i;
  AST *one;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _aux;
  Binds local_438;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_420;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  local_408;
  LiteralNumber *local_3e8;
  long local_3e0;
  sockaddr *local_3d8;
  Error *local_3d0;
  Var *local_3c8;
  Apply *local_3c0;
  Apply *local_3b8;
  Conditional *local_3b0;
  void *local_3a8;
  void *local_3a0;
  Var *local_398;
  Var *local_390;
  Local *local_388;
  Apply *local_380;
  Var *local_378;
  Binary *local_370;
  Conditional *local_368;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_360;
  UString local_348;
  UString local_328;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_308;
  UStringStream ss;
  ArgParam local_298;
  Desugarer local_240 [11];
  ArgParam local_190 [2];
  ArgParam local_e0 [2];
  
  uVar5 = ((long)(ast->specs).
                 super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(ast->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x60;
  local_3e8 = make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                        (this,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,(char (*) [4])"0.0");
  one = &make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                   (this,(LocationRange *)E,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(char (*) [4])"1.0")->super_AST;
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&ss,L"$r",(allocator<char32_t> *)local_190);
  local_4a0 = id(this,&ss.buf);
  ::std::__cxx11::u32string::~u32string((u32string *)&ss);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&ss,L"$l",(allocator<char32_t> *)local_190);
  local_490 = (sockaddr *)id(this,&ss.buf);
  local_4c0 = this;
  local_4a8 = ast;
  ::std::__cxx11::u32string::~u32string((u32string *)&ss);
  iVar15 = (int)uVar5;
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&_i,(long)iVar15,(allocator_type *)&ss);
  uVar14 = 0;
  uVar18 = uVar5 & 0xffffffff;
  if (iVar15 < 1) {
    uVar18 = uVar14;
  }
  local_4c8 = uVar5;
  for (; uVar18 != uVar14; uVar14 = uVar14 + 1) {
    ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
    ss.buf._M_string_length = 0;
    ss.buf.field_2._M_local_buf[0] = L'\0';
    ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&ss.buf,L"$i_");
    UStringStream::operator<<((UStringStream *)&ss.buf,(int)uVar14);
    ::std::__cxx11::u32string::u32string((u32string *)local_190,&ss.buf);
    pIVar6 = id(local_4c0,(UString *)local_190);
    _i.
    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14] = pIVar6;
    ::std::__cxx11::u32string::~u32string((u32string *)local_190);
    ::std::__cxx11::u32string::~u32string((u32string *)&ss.buf);
  }
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&_aux,(long)iVar15,(allocator_type *)&ss);
  for (uVar5 = 0; pDVar17 = local_4c0, uVar18 != uVar5; uVar5 = uVar5 + 1) {
    ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
    ss.buf._M_string_length = 0;
    ss.buf.field_2._M_local_buf[0] = L'\0';
    ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&ss.buf,L"$aux_");
    UStringStream::operator<<((UStringStream *)&ss.buf,(int)uVar5);
    ::std::__cxx11::u32string::u32string((u32string *)local_190,&ss.buf);
    pIVar6 = id(local_4c0,(UString *)local_190);
    _aux.
    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar5] = pIVar6;
    ::std::__cxx11::u32string::~u32string((u32string *)local_190);
    ::std::__cxx11::u32string::~u32string((u32string *)&ss.buf);
  }
  pCVar7 = (local_4a8->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar7->kind != FOR) {
    __assert_fail("ast->specs[0].kind == ComprehensionSpec::FOR",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                  ,0x1b4,
                  "AST *jsonnet::internal::Desugarer::makeArrayComprehension(ArrayComprehension *)")
    ;
  }
  lVar20 = (long)((int)local_4c8 + -1);
  lVar19 = lVar20 * 8 + 8;
  lVar13 = lVar20 * 0x60;
  pCVar7 = pCVar7 + lVar20;
  do {
    lVar19 = lVar19 + -8;
    pKVar3 = &pCVar7->kind;
    pCVar7 = pCVar7 + -1;
  } while (*pKVar3 != FOR);
  pAVar1 = local_4a8->body;
  local_e0[0].idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)var(local_4c0,
                    *(Identifier **)
                     ((long)_aux.
                            super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar19));
  local_328._M_dataplus._M_p =
       (pointer)var(pDVar17,*(Identifier **)
                             ((long)_i.
                                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar19));
  local_420.
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  pBVar8 = make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                     (pDVar17,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)&local_328,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(BinaryOp *)&local_420,&one);
  pAVar4 = local_4a8;
  ArgParam::ArgParam((ArgParam *)&ss,&pBVar8->super_AST,(Fodder *)EF);
  local_348._M_dataplus._M_p = (pointer)var(pDVar17,local_4a0);
  local_438.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  local_360.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)singleton(pDVar17,pAVar4->body);
  pBVar8 = make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Array*>
                     (pDVar17,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)&local_348,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(BinaryOp *)&local_438,(Array **)&local_360);
  ArgParam::ArgParam(&local_298,&pBVar8->super_AST,(Fodder *)EF);
  __l._M_len = 2;
  __l._M_array = (iterator)&ss;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_190,__l,(allocator_type *)&local_308);
  local_408.
  super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_408.
                        super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  out = (AST *)CONCAT71(out._1_7_,1);
  pAVar9 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (pDVar17,&pAVar1->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)local_e0,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                             *)local_190,(bool *)&local_408,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(bool *)&out);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_190);
  lVar19 = 0x58;
  do {
    ArgParam::~ArgParam((ArgParam *)((long)&ss.buf._M_dataplus._M_p + lVar19));
    lVar19 = lVar19 + -0x58;
  } while (lVar19 != -0x58);
  loc = &(local_4a8->super_AST).location;
  local_478 = lVar20 * 8;
  local_4b0 = loc;
  in = &pAVar9->super_AST;
  while( true ) {
    pAVar1 = in;
    lVar19 = lVar13 + -0x60;
    local_4c8 = lVar20;
    if ((int)lVar20 < 0) break;
    pCVar7 = (local_4a8->specs).
             super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)lVar20 == 0) {
      out = &var(pDVar17,local_4a0)->super_AST;
    }
    else {
      piVar10 = (int *)((long)&pCVar7[-1].kind + lVar13);
      lVar13 = local_478;
      do {
        lVar13 = lVar13 + -8;
        iVar15 = *piVar10;
        piVar10 = piVar10 + -0x18;
      } while (iVar15 != 0);
      local_e0[0].idFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)var(pDVar17,*(Identifier **)
                                 ((long)_aux.
                                        super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar13));
      local_328._M_dataplus._M_p =
           (pointer)var(pDVar17,*(Identifier **)
                                 ((long)_i.
                                        super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar13));
      local_348._M_dataplus._M_p._0_4_ = 3;
      pBVar8 = make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                         (pDVar17,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Var **)&local_328,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(BinaryOp *)&local_348,&one);
      ArgParam::ArgParam((ArgParam *)&ss,&pBVar8->super_AST,(Fodder *)EF);
      pVVar11 = var(pDVar17,local_4a0);
      ArgParam::ArgParam(&local_298,&pVVar11->super_AST,(Fodder *)EF);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&ss;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_190,__l_00,(allocator_type *)&local_360);
      local_420.
      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           (uint)local_420.
                 super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0xffffff00;
      local_438.
      super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           CONCAT31(local_438.
                    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_3_,1);
      out = &make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                       (pDVar17,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Var **)local_e0,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                               *)local_190,(bool *)&local_420,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(bool *)&local_438)->super_AST;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              local_190);
      lVar13 = 0x58;
      do {
        ArgParam::~ArgParam((ArgParam *)((long)&ss.buf._M_dataplus._M_p + lVar13));
        lVar13 = lVar13 + -0x58;
        loc = local_4b0;
      } while (lVar13 != -0x58);
    }
    pDVar17 = local_4c0;
    uVar16 = (uint)local_4c8 & 0x7fffffff;
    pCVar7 = pCVar7 + uVar16;
    if (pCVar7->kind == FOR) {
      local_3e0 = lVar19;
      bind((Desugarer *)&ss,(int)local_4c0,local_490,(socklen_t)pCVar7->expr);
      psVar2 = (sockaddr *)
               _aux.
               super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16];
      ArgParam::ArgParam(local_190,(Fodder *)EF,
                         _i.
                         super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16],(Fodder *)EF);
      ArgParam::ArgParam(local_190 + 1,(Fodder *)EF,local_4a0,(Fodder *)EF);
      __l_01._M_len = 2;
      __l_01._M_array = local_190;
      local_3d8 = psVar2;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      vector(&local_420,__l_01,&local_4b1);
      pDVar17 = local_4c0;
      local_4c9 = false;
      local_378 = var(local_4c0,
                      _i.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16]);
      local_47c = BOP_GREATER_EQ;
      pVVar11 = var(pDVar17,(Identifier *)local_490);
      local_380 = length(pDVar17,&pVVar11->super_AST);
      local_370 = make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Apply*>
                            (pDVar17,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_378,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_47c,&local_380);
      pIVar6 = pCVar7->var;
      local_390 = var(pDVar17,(Identifier *)local_490);
      local_4ca = false;
      local_398 = var(pDVar17,_i.
                              super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16]);
      local_3a0 = (void *)0x0;
      local_3a8 = (void *)0x0;
      body = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                       (pDVar17,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_390,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_4ca,&local_398,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_3a0,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_3a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF);
      singleBind(&local_438,pDVar17,pIVar6,&body->super_AST);
      local_388 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                            (pDVar17,local_4b0,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_438,&in);
      local_368 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Local*>
                            (pDVar17,local_4b0,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_370,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&out,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_388);
      pFVar12 = make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Conditional*>
                          (pDVar17,local_4b0,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF,&local_420,&local_4c9,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&local_368);
      bind(local_240,(int)pDVar17,local_3d8,(socklen_t)pFVar12);
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)&ss;
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::vector(&local_360,__l_02,&local_4b2);
      pDVar17 = local_4c0;
      pVVar11 = var(local_4c0,(Identifier *)local_490);
      pAVar9 = type(pDVar17,&pVVar11->super_AST);
      ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((u32string *)&local_328,L"array",&local_4b3);
      pDVar17 = local_4c0;
      b = str(local_4c0,&local_328);
      local_3b8 = equals(pDVar17,local_4b0,&pAVar9->super_AST,&b->super_AST);
      local_3c8 = var(pDVar17,_aux.
                              super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16]);
      ArgParam::ArgParam(local_e0,&local_3e8->super_AST,(Fodder *)EF);
      loc = local_4b0;
      if ((int)local_4c8 == 0) {
        local_408.
        super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_408.
        super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_408.
        super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_4cb = false;
        expr = make<jsonnet::internal::Array,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (pDVar17,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_408,&local_4cb,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF);
      }
      else {
        expr = (Array *)var(pDVar17,local_4a0);
      }
      ArgParam::ArgParam(local_e0 + 1,&expr->super_AST,(Fodder *)EF);
      __l_03._M_len = 2;
      __l_03._M_array = local_e0;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      vector(&local_308,__l_03,&local_4b4);
      local_4cc = false;
      local_4cd = true;
      local_3c0 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                            (pDVar17,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_3c8,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_308,&local_4cc,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_4cd);
      ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((u32string *)&local_348,L"In comprehension, can only iterate over array.",
                 &local_4b5);
      local_3d0 = error(pDVar17,loc,&local_348);
      local_3b0 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                            (pDVar17,loc,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_3b8,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_3c0,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_3d0);
      in = &make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                      (pDVar17,loc,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,&local_360,&local_3b0)->super_AST;
      ::std::__cxx11::u32string::~u32string((u32string *)&local_348);
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector(&local_308);
      lVar19 = 0x58;
      do {
        ArgParam::~ArgParam((ArgParam *)
                            ((long)&local_e0[0].idFodder.
                                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar19));
        lVar19 = lVar19 + -0x58;
      } while (lVar19 != -0x58);
      if ((int)local_4c8 == 0) {
        ::std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::~vector(&local_408);
      }
      ::std::__cxx11::u32string::~u32string((u32string *)&local_328);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::~vector(&local_360);
      lVar19 = 0xb0;
      do {
        Local::Bind::~Bind((Bind *)((long)&ss.buf._M_dataplus._M_p + lVar19));
        lVar19 = lVar19 + -0xb0;
      } while (lVar19 != -0xb0);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::~vector(&local_438);
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector(&local_420);
      lVar19 = 0x58;
      do {
        ArgParam::~ArgParam((ArgParam *)
                            ((long)&local_190[0].idFodder.
                                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar19));
        lVar19 = lVar19 + -0x58;
        lVar13 = local_3e0;
      } while (lVar19 != -0x58);
    }
    else {
      lVar13 = lVar19;
      if (pCVar7->kind == IF) {
        in = &make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                        (local_4c0,loc,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&pCVar7->expr,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&in,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&out)->super_AST;
      }
    }
    lVar20 = local_4c8 + -1;
    local_478 = local_478 + -8;
  }
  ::std::
  _Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Vector_base(&_aux.
                   super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 );
  ::std::
  _Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Vector_base(&_i.
                   super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 );
  return pAVar1;
}

Assistant:

AST* makeArrayComprehension(ArrayComprehension *ast) {
        int n = ast->specs.size();
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        AST *one = make<LiteralNumber>(E, EF, "1.0");
        auto *_r = id(U"$r");
        auto *_l = id(U"$l");
        std::vector<const Identifier *> _i(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$i_" << i;
            _i[i] = id(ss.str());
        }
        std::vector<const Identifier *> _aux(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$aux_" << i;
            _aux[i] = id(ss.str());
        }

        // Build it from the inside out.  We keep wrapping 'in' with more ASTs.
        assert(ast->specs[0].kind == ComprehensionSpec::FOR);

        int last_for = n - 1;
        while (ast->specs[last_for].kind != ComprehensionSpec::FOR)
            last_for--;
        // $aux_{last_for}($i_{last_for} + 1, $r + [body])
        AST *in = make<Apply>(
            ast->body->location,
            EF,
            var(_aux[last_for]),
            EF,
            ArgParams{{make<Binary>(E, EF, var(_i[last_for]), EF, BOP_PLUS, one), EF},
                {make<Binary>(E, EF, var(_r), EF, BOP_PLUS, singleton(ast->body)), EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
        for (int i = n - 1; i >= 0; --i) {
            const ComprehensionSpec &spec = ast->specs[i];
            AST *out;
            if (i > 0) {
                int prev_for = i - 1;
                while (ast->specs[prev_for].kind != ComprehensionSpec::FOR)
                    prev_for--;

                // aux_{prev_for}($i_{prev_for} + 1, $r)
                out = make<Apply>(  // False branch.
                    E,
                    EF,
                    var(_aux[prev_for]),
                    EF,
                    ArgParams{{
                        make<Binary>(E, EF, var(_i[prev_for]), EF, BOP_PLUS, one),
                            EF,
                            },
                      {
                        var(_r),
                            EF,
                            }},
                    false,  // trailingComma
                    EF,
                    EF,
                    true  // tailstrict
                );
            } else {
                out = var(_r);
            }
            switch (spec.kind) {
                case ComprehensionSpec::IF: {
                  /*
                    if [[[...cond...]]] then
                    [[[...in...]]]
                    else
                    [[[...out...]]]
                  */
                    in = make<Conditional>(ast->location,
                                           EF,
                                           spec.expr,
                                           EF,
                                           in,  // True branch.
                                           EF,
                                           out);  // False branch.
                } break;
                case ComprehensionSpec::FOR: {
                    /*
                      local $l = [[[...array...]]]
                      aux_{i}(i_{i}, r) =
                      if i_{i} >= std.length($l) then
                      [[[...out...]]]
                      else
                      local [[[...var...]]] = $l[i_{i}];
                      [[[...in...]]];
                      if std.type($l) == "array" then
                      aux_{i}(0, $r) tailstrict
                      else
                      error "In comprehension, can only iterate over array..";
                    */
                    in = make<Local>(
                        ast->location,
                        EF,
                        Local::Binds{
                          bind(_l, spec.expr),  // Need to check expr is an array
                              bind(_aux[i],
                                   make<Function>(
                                       ast->location,
                                       EF,
                                       EF,
                                       ArgParams{{EF, _i[i], EF}, {EF, _r, EF}},
                                       false,  // trailingComma
                                       EF,
                                       make<Conditional>(ast->location,
                                                         EF,
                                                         make<Binary>(E,
                                                                      EF,
                                                                      var(_i[i]),
                                                                      EF,
                                                                      BOP_GREATER_EQ,
                                                                      length(var(_l))),
                                                         EF,
                                                         out,
                                                         EF,
                                                         make<Local>(
                                                             ast->location,
                                                             EF,
                                                             singleBind(spec.var,
                                                                        make<Index>(E,
                                                                                    EF,
                                                                                    var(_l),
                                                                                    EF,
                                                                                    false,
                                                                                    var(_i[i]),
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF)),
                                                             in))))},
                        make<Conditional>(
                            ast->location,
                            EF,
                            equals(ast->location, type(var(_l)), str(U"array")),
                            EF,
                            make<Apply>(
                                E,
                                EF,
                                var(_aux[i]),
                                EF,
                                ArgParams{{zero, EF},
                                  {
                                    i == 0 ? make<Array>(
                                        E, EF, Array::Elements{}, false, EF)
                                        : static_cast<AST *>(var(_r)),
                                        EF,
                                        }},
                                false,  // trailingComma
                                EF,
                                EF,
                                true),  // tailstrict
                            EF,
                            error(ast->location,
                                  U"In comprehension, can only iterate over array.")));
                } break;
            }
        }

        return in;
    }